

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionFind.h
# Opt level: O0

int __thiscall covenant::UnionFind::set(UnionFind *this,int src,int dest)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RDI;
  int esrc;
  int edest;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar4;
  
  iVar1 = lookup((UnionFind *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe4);
  iVar2 = lookup((UnionFind *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  iVar4 = iVar1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)iVar2);
  *pvVar3 = iVar1;
  return iVar4;
}

Assistant:

int set(int src, int dest){
      int edest = lookup(dest);
      int esrc = lookup(src);
      mapping[esrc] = edest;
      return edest;
    }